

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O2

void __thiscall VertexBuffer::~VertexBuffer(VertexBuffer *this)

{
  (*glad_glDeleteBuffers)(1,&this->m_id);
  std::_Vector_base<BufferElement,_std::allocator<BufferElement>_>::~_Vector_base
            ((_Vector_base<BufferElement,_std::allocator<BufferElement>_> *)&this->m_layout);
  return;
}

Assistant:

VertexBuffer::~VertexBuffer()
{
    glDeleteBuffers(1, &m_id);
}